

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O3

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,Program *program)

{
  iterator iVar1;
  iterator iVar2;
  
  iVar1 = Program::begin_abi_cxx11_(program);
  while( true ) {
    iVar2 = Program::end_abi_cxx11_(program);
    if (iVar1._M_node == iVar2._M_node) break;
    (**(code **)**(undefined8 **)(iVar1._M_node + 2))(*(undefined8 **)(iVar1._M_node + 2),this);
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  this->pass = this->pass + 1;
  iVar1 = Program::begin_abi_cxx11_(program);
  while( true ) {
    iVar2 = Program::end_abi_cxx11_(program);
    if (iVar1._M_node == iVar2._M_node) break;
    (**(code **)**(undefined8 **)(iVar1._M_node + 2))(*(undefined8 **)(iVar1._M_node + 2),this);
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  this->pass = this->pass + 1;
  iVar1 = Program::begin_abi_cxx11_(program);
  while( true ) {
    iVar2 = Program::end_abi_cxx11_(program);
    if (iVar1._M_node == iVar2._M_node) break;
    (**(code **)**(undefined8 **)(iVar1._M_node + 2))(*(undefined8 **)(iVar1._M_node + 2),this);
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(Program *program) {
    std::map<std::string, SourceFile*>::iterator it;

    // First, we add all classes, structs, enums and other named types to
    // the symbol table of a source file.
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    ++pass;

    // Now that named types are inserted on symbol tables, some form of type
    // checking can be done. But first we link types to their descriptors. The types
    // we are linking to its descriptors are: return types of methods and functions,
    // parameters' types, class variable types, parent class and stuff like that.
    // Note that we are linking only types to its descriptors. The insertion
    // on symbol table comes latter. In other words, we are linking everything now
    // and on later passes we may discard some of these associations. For example,
    // two methods with the same signature or two class variables with same name
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    ++pass;

    // now we build the symbol table for the function and method bodies
    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }
}